

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

void __thiscall SpeciesTracker::Remove(SpeciesTracker *this,string *promoter_name,Ptr *polymer)

{
  pointer psVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  __normal_iterator<std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
  __position;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
  *this_00;
  
  this_00 = &this->promoter_map_;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
          ::count(this_00,promoter_name);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](this_00,promoter_name);
    psVar1 = (pmVar3->
             super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](this_00,promoter_name);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Polymer>*,std::vector<std::shared_ptr<Polymer>,std::allocator<std::shared_ptr<Polymer>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Polymer>const>>
                           (psVar1,(pmVar3->
                                   super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish,polymer);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](this_00,promoter_name);
    if (__position._M_current !=
        (pmVar3->
        super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
               ::operator[](this_00,promoter_name);
      std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::erase
                (pmVar3,(const_iterator)__position._M_current);
      return;
    }
  }
  return;
}

Assistant:

void SpeciesTracker::Remove(const std::string &promoter_name,
                            Polymer::Ptr polymer) {
  if (promoter_map_.count(promoter_name) != 0) {
    auto it = std::find(promoter_map_[promoter_name].begin(),
                        promoter_map_[promoter_name].end(), polymer);
    if (it != promoter_map_[promoter_name].end()) {
      promoter_map_[promoter_name].erase(it);
    }
  }
}